

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O1

String * __thiscall
capnp::anon_unknown_79::Parser::consumeQuotedString(String *__return_storage_ptr__,Parser *this)

{
  Input *this_00;
  char *pcVar1;
  RemoveConst<char> *pRVar2;
  unsigned_long uVar3;
  undefined8 uVar4;
  String *pSVar5;
  char cVar6;
  byte bVar7;
  byte *pbVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  size_t sVar12;
  size_t newSize;
  byte *pbVar13;
  char *pcVar14;
  size_t sVar15;
  ArrayPtr<const_char16_t> utf16;
  Vector<char> decoded;
  Fault f;
  DebugComparison<unsigned_long,_int> _kjCondition;
  Vector<char> local_98;
  Fault local_70;
  DebugComparison<unsigned_long,_int> local_68;
  String *local_38;
  
  this_00 = &this->input;
  local_38 = __return_storage_ptr__;
  Input::consume(this_00,'\"');
  pcVar14 = (this->input).wrapped.ptr;
  while (((((this->input).wrapped.size_ != 0 && (*(this_00->wrapped).ptr != '\0')) &&
          (cVar6 = Input::nextChar(this_00), cVar6 != '\"')) && (cVar6 != '\\'))) {
    Input::advance(this_00,1);
  }
  pcVar1 = (this_00->wrapped).ptr;
  sVar15 = (long)pcVar1 - (long)pcVar14;
  cVar6 = Input::nextChar(this_00);
  if (cVar6 == '\"') {
    Input::advance(this_00,1);
    pSVar5 = local_38;
    kj::heapString(local_38,pcVar14,sVar15);
    local_38 = pSVar5;
  }
  else {
    local_98.builder.ptr = (char *)0x0;
    local_98.builder.pos = (RemoveConst<char> *)0x0;
    local_98.builder.endPtr = (char *)0x0;
    local_98.builder.disposer = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
    if (sVar15 != 0) {
      newSize = 4;
      if (4 < sVar15) {
        newSize = sVar15;
      }
      kj::Vector<char>::setCapacity(&local_98,newSize);
    }
    pRVar2 = local_98.builder.pos;
    if (pcVar1 != pcVar14) {
      memcpy(local_98.builder.pos,pcVar14,sVar15);
      local_98.builder.pos = pRVar2 + sVar15;
    }
    do {
      pcVar14 = (this->input).wrapped.ptr;
      while ((((this->input).wrapped.size_ != 0 && (*(this_00->wrapped).ptr != '\0')) &&
             ((cVar6 = Input::nextChar(this_00), cVar6 != '\"' && (cVar6 != '\\'))))) {
        Input::advance(this_00,1);
      }
      pcVar1 = (this_00->wrapped).ptr;
      sVar12 = (long)pcVar1 - (long)pcVar14;
      pbVar8 = (byte *)(local_98.builder.pos + (sVar12 - (long)local_98.builder.ptr));
      if (local_98.builder.endPtr + -(long)local_98.builder.ptr < pbVar8) {
        pbVar13 = (byte *)((long)(local_98.builder.endPtr + -(long)local_98.builder.ptr) * 2);
        if (local_98.builder.endPtr == local_98.builder.ptr) {
          pbVar13 = (byte *)0x4;
        }
        if (pbVar13 < pbVar8) {
          pbVar13 = pbVar8;
        }
        kj::Vector<char>::setCapacity(&local_98,(size_t)pbVar13);
      }
      pRVar2 = local_98.builder.pos;
      if (pcVar1 != pcVar14) {
        memcpy(local_98.builder.pos,pcVar14,sVar12);
        local_98.builder.pos = pRVar2 + sVar12;
      }
      cVar6 = Input::nextChar(this_00);
      if (cVar6 == '\\') {
        Input::advance(this_00,1);
        bVar7 = Input::nextChar(this_00);
        if (bVar7 < 0x62) {
          if (bVar7 == 0x22) {
            bVar7 = 0x22;
            if (local_98.builder.pos == local_98.builder.endPtr) {
              sVar15 = ((long)local_98.builder.endPtr - (long)local_98.builder.ptr) * 2;
              if (local_98.builder.endPtr == local_98.builder.ptr) {
                sVar15 = 4;
              }
              kj::Vector<char>::setCapacity(&local_98,sVar15);
            }
          }
          else if (bVar7 == 0x2f) {
            bVar7 = 0x2f;
            if (local_98.builder.pos == local_98.builder.endPtr) {
              sVar15 = ((long)local_98.builder.endPtr - (long)local_98.builder.ptr) * 2;
              if (local_98.builder.endPtr == local_98.builder.ptr) {
                sVar15 = 4;
              }
              kj::Vector<char>::setCapacity(&local_98,sVar15);
            }
          }
          else {
            if (bVar7 != 0x5c) goto switchD_0017c4fe_caseD_6f;
            bVar7 = 0x5c;
            if (local_98.builder.pos == local_98.builder.endPtr) {
              sVar15 = ((long)local_98.builder.endPtr - (long)local_98.builder.ptr) * 2;
              if (local_98.builder.endPtr == local_98.builder.ptr) {
                sVar15 = 4;
              }
              kj::Vector<char>::setCapacity(&local_98,sVar15);
            }
          }
        }
        else {
          switch(bVar7) {
          case 0x6e:
            bVar7 = 10;
            if (local_98.builder.pos == local_98.builder.endPtr) {
              sVar15 = ((long)local_98.builder.endPtr - (long)local_98.builder.ptr) * 2;
              if (local_98.builder.endPtr == local_98.builder.ptr) {
                sVar15 = 4;
              }
              kj::Vector<char>::setCapacity(&local_98,sVar15);
            }
            break;
          case 0x6f:
          case 0x70:
          case 0x71:
          case 0x73:
switchD_0017c4fe_caseD_6f:
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[31]>
                      ((Fault *)&local_68,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
                       ,0x31e,FAILED,(char *)0x0,"\"Invalid escape in JSON string.\"",
                       (char (*) [31])"Invalid escape in JSON string.");
            kj::_::Debug::Fault::fatal((Fault *)&local_68);
          case 0x72:
            bVar7 = 0xd;
            if (local_98.builder.pos == local_98.builder.endPtr) {
              sVar15 = ((long)local_98.builder.endPtr - (long)local_98.builder.ptr) * 2;
              if (local_98.builder.endPtr == local_98.builder.ptr) {
                sVar15 = 4;
              }
              kj::Vector<char>::setCapacity(&local_98,sVar15);
            }
            break;
          case 0x74:
            bVar7 = 9;
            if (local_98.builder.pos == local_98.builder.endPtr) {
              sVar15 = ((long)local_98.builder.endPtr - (long)local_98.builder.ptr) * 2;
              if (local_98.builder.endPtr == local_98.builder.ptr) {
                sVar15 = 4;
              }
              kj::Vector<char>::setCapacity(&local_98,sVar15);
            }
            break;
          case 0x75:
            Input::consume(this_00,'u');
            pcVar14 = (this_00->wrapped).ptr;
            Input::advance(this_00,4);
            local_68.left = (unsigned_long)((this_00->wrapped).ptr + -(long)pcVar14);
            local_68.right = 4;
            local_68.op.content.ptr = " == ";
            local_68.op.content.size_ = 5;
            local_68.result = (char *)local_68.left == (char *)0x4;
            if (!local_68.result) {
              kj::_::Debug::Fault::
              Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&>
                        (&local_70,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
                         ,0x345,FAILED,"hex.size() == 4","_kjCondition,",&local_68);
              kj::_::Debug::Fault::fatal(&local_70);
            }
            lVar9 = 0;
            uVar11 = 0;
            do {
              cVar6 = pcVar14[lVar9];
              utf16.size_._0_4_ = (int)cVar6;
              local_70.exception._0_2_ = CONCAT11(local_70.exception._1_1_,cVar6);
              iVar10 = -0x30;
              if (((9 < (byte)(cVar6 - 0x30U)) && (iVar10 = -0x57, 5 < (byte)(cVar6 + 0x9fU))) &&
                 (iVar10 = -0x37, 5 < (byte)(cVar6 + 0xbfU))) {
                kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[37],char&>
                          ((Fault *)&local_68,
                           "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
                           ,0x353,FAILED,(char *)0x0,"\"Invalid hex digit in unicode escape.\", c",
                           (char (*) [37])"Invalid hex digit in unicode escape.",(char *)&local_70);
                kj::_::Debug::Fault::fatal((Fault *)&local_68);
              }
              uVar11 = iVar10 + (int)utf16.size_ | uVar11 << 4;
              lVar9 = lVar9 + 1;
            } while (lVar9 != 4);
            if ((int)uVar11 < 0x80) {
              if (local_98.builder.pos == local_98.builder.endPtr) {
                sVar15 = ((long)local_98.builder.endPtr - (long)local_98.builder.ptr) * 2;
                if (local_98.builder.endPtr == local_98.builder.ptr) {
                  sVar15 = 4;
                }
                kj::Vector<char>::setCapacity(&local_98,sVar15);
              }
              *local_98.builder.pos = (byte)uVar11 & 0x7f;
              local_98.builder.pos = local_98.builder.pos + 1;
            }
            else {
              local_70.exception._0_2_ = (undefined2)uVar11;
              utf16.ptr = (char16_t *)0x1;
              utf16.size_._4_4_ = 0;
              kj::decodeUtf16((EncodingResult<kj::String> *)&local_68,(kj *)&local_70,utf16);
              pcVar14 = (char *)(local_68.left + local_68._8_8_ + -1);
              pcVar1 = (char *)local_68.left;
              if (local_68._8_8_ == 0) {
                pcVar14 = (char *)0x0;
                pcVar1 = (char *)0x0;
              }
              sVar12 = (long)pcVar14 - (long)pcVar1;
              pbVar8 = (byte *)(local_98.builder.pos + (sVar12 - (long)local_98.builder.ptr));
              if (local_98.builder.endPtr + -(long)local_98.builder.ptr < pbVar8) {
                pbVar13 = (byte *)((long)(local_98.builder.endPtr + -(long)local_98.builder.ptr) * 2
                                  );
                if (local_98.builder.endPtr == local_98.builder.ptr) {
                  pbVar13 = (byte *)0x4;
                }
                if (pbVar13 < pbVar8) {
                  pbVar13 = pbVar8;
                }
                kj::Vector<char>::setCapacity(&local_98,(size_t)pbVar13);
              }
              pRVar2 = local_98.builder.pos;
              if (pcVar1 != pcVar14) {
                memcpy(local_98.builder.pos,pcVar1,sVar12);
                local_98.builder.pos = pRVar2 + sVar12;
              }
              uVar4 = local_68._8_8_;
              uVar3 = local_68.left;
              if ((char *)local_68.left != (char *)0x0) {
                local_68.left = 0;
                local_68._8_8_ = 0;
                (*(code *)**(undefined8 **)local_68.op.content.ptr)
                          (local_68.op.content.ptr,uVar3,1,uVar4,uVar4,0);
              }
            }
            goto LAB_0017c7a9;
          default:
            if (bVar7 == 0x62) {
              bVar7 = 8;
              if (local_98.builder.pos == local_98.builder.endPtr) {
                sVar15 = ((long)local_98.builder.endPtr - (long)local_98.builder.ptr) * 2;
                if (local_98.builder.endPtr == local_98.builder.ptr) {
                  sVar15 = 4;
                }
                kj::Vector<char>::setCapacity(&local_98,sVar15);
              }
            }
            else {
              if (bVar7 != 0x66) goto switchD_0017c4fe_caseD_6f;
              bVar7 = 0xc;
              if (local_98.builder.pos == local_98.builder.endPtr) {
                sVar15 = ((long)local_98.builder.endPtr - (long)local_98.builder.ptr) * 2;
                if (local_98.builder.endPtr == local_98.builder.ptr) {
                  sVar15 = 4;
                }
                kj::Vector<char>::setCapacity(&local_98,sVar15);
              }
            }
          }
        }
        *local_98.builder.pos = bVar7;
        local_98.builder.pos = local_98.builder.pos + 1;
        Input::advance(this_00,1);
      }
LAB_0017c7a9:
      cVar6 = Input::nextChar(this_00);
    } while (cVar6 != '\"');
    Input::consume(this_00,'\"');
    if (local_98.builder.pos == local_98.builder.endPtr) {
      sVar15 = 4;
      if (local_98.builder.endPtr != local_98.builder.ptr) {
        sVar15 = ((long)local_98.builder.endPtr - (long)local_98.builder.ptr) * 2;
      }
      kj::Vector<char>::setCapacity(&local_98,sVar15);
    }
    *local_98.builder.pos = 0;
    local_98.builder.pos = local_98.builder.pos + 1;
    if (local_98.builder.pos != local_98.builder.endPtr) {
      kj::Vector<char>::setCapacity
                (&local_98,(long)local_98.builder.pos - (long)local_98.builder.ptr);
    }
    (local_38->content).ptr = local_98.builder.ptr;
    (local_38->content).size_ = (long)local_98.builder.pos - (long)local_98.builder.ptr;
    (local_38->content).disposer = local_98.builder.disposer;
  }
  return local_38;
}

Assistant:

kj::String consumeQuotedString() {
    input.consume('"');
    // TODO(perf): Get statistics on string size and preallocate?

    auto initalString = input.consumeWhile([](const char chr) {
        return chr != '"' && chr != '\\';
    });
    if (input.nextChar() == '"') {
      // optimization: Avoid allocating vector if no escapes encountered.
      input.advance();
      return kj::heapString(initalString.begin(), initalString.size());
    }

    kj::Vector<char> decoded;
    decoded.addAll(initalString);

    do {
      auto stringValue = input.consumeWhile([](const char chr) {
          return chr != '"' && chr != '\\';
      });

      decoded.addAll(stringValue);

      if (input.nextChar() == '\\') {  // handle escapes.
        input.advance();
        switch(input.nextChar()) {
          case '"' : decoded.add('"' ); input.advance(); break;
          case '\\': decoded.add('\\'); input.advance(); break;
          case '/' : decoded.add('/' ); input.advance(); break;
          case 'b' : decoded.add('\b'); input.advance(); break;
          case 'f' : decoded.add('\f'); input.advance(); break;
          case 'n' : decoded.add('\n'); input.advance(); break;
          case 'r' : decoded.add('\r'); input.advance(); break;
          case 't' : decoded.add('\t'); input.advance(); break;
          case 'u' :
            input.consume('u');
            unescapeAndAppend(input.consume(size_t(4)), decoded);
            break;
          default: KJ_FAIL_REQUIRE("Invalid escape in JSON string."); break;
        }
      }

    } while(input.nextChar() != '"');

    input.consume('"');
    decoded.add('\0');

    // TODO(perf): This copy can be eliminated, but I can't find the kj::wayToDoIt();
    return kj::String(decoded.releaseAsArray());
  }